

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::SlopesEqual(TEdge *e1,TEdge *e2,bool UseFullInt64Range)

{
  Int128 local_48;
  Int128 local_38;
  undefined1 local_21;
  TEdge *pTStack_20;
  bool UseFullInt64Range_local;
  TEdge *e2_local;
  TEdge *e1_local;
  
  if (UseFullInt64Range) {
    local_21 = UseFullInt64Range;
    pTStack_20 = e2;
    e2_local = e1;
    Int128Mul((ClipperLib *)&local_38,(e1->Top).Y - (e1->Bot).Y,(e2->Top).X - (e2->Bot).X);
    Int128Mul((ClipperLib *)&local_48,(e2_local->Top).X - (e2_local->Bot).X,
              (pTStack_20->Top).Y - (pTStack_20->Bot).Y);
    e1_local._7_1_ = Int128::operator==(&local_38,&local_48);
  }
  else {
    e1_local._7_1_ =
         ((e1->Top).Y - (e1->Bot).Y) * ((e2->Top).X - (e2->Bot).X) -
         ((e1->Top).X - (e1->Bot).X) * ((e2->Top).Y - (e2->Bot).Y) == 0;
  }
  return e1_local._7_1_;
}

Assistant:

bool SlopesEqual(const TEdge &e1, const TEdge &e2, bool UseFullInt64Range)
{
#ifndef use_int32
  if (UseFullInt64Range)
    return Int128Mul(e1.Top.Y - e1.Bot.Y, e2.Top.X - e2.Bot.X) == 
    Int128Mul(e1.Top.X - e1.Bot.X, e2.Top.Y - e2.Bot.Y);
  else 
#endif
    return (e1.Top.Y - e1.Bot.Y) * (e2.Top.X - e2.Bot.X) == 
    (e1.Top.X - e1.Bot.X) * (e2.Top.Y - e2.Bot.Y);
}